

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asList
          (ListBuilder *__return_storage_ptr__,OrphanBuilder *this,ElementSize elementSize)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  ushort uVar3;
  SegmentId id;
  uint uVar4;
  uint uVar5;
  CapTableBuilder *pCVar6;
  word *pwVar7;
  ElementSize EVar8;
  SegmentBuilder *this_00;
  SegmentBuilder **ppSVar9;
  ulong uVar10;
  OrphanBuilder *pOVar11;
  OrphanBuilder *pOVar12;
  Fault f;
  Fault local_38;
  
  uVar4 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value != 0 || uVar4 != 0) {
    this_00 = this->segment;
    pCVar6 = this->capTable;
    if ((uVar4 & 3) == 2) {
      this_00 = BuilderArena::getSegment((BuilderArena *)(this_00->super_SegmentReader).arena,id);
      uVar4 = (uint)(this->tag).content;
      pwVar7 = (this_00->super_SegmentReader).ptr.ptr;
      uVar10 = (ulong)(uVar4 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar7->content + uVar10);
      pOVar12 = (OrphanBuilder *)((long)&pwVar7[1].content + uVar10);
      if ((uVar4 & 4) == 0) {
        pOVar11 = (OrphanBuilder *)(&pOVar12->tag + ((int)(pOVar1->tag).content >> 2));
        pOVar12 = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pOVar11 = (OrphanBuilder *)
                  ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                  (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pOVar11 = (OrphanBuilder *)this->location;
      pOVar12 = this;
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    if (((pOVar12->tag).content & 3) == 1) {
      uVar4 = *(uint *)((long)&(pOVar12->tag).content + 4);
      EVar8 = (ElementSize)uVar4 & INLINE_COMPOSITE;
      if (EVar8 == INLINE_COMPOSITE) {
        uVar4 = (uint)(pOVar11->tag).content;
        if ((uVar4 & 3) != 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
                    (&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x502,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          kj::_::Debug::Fault::fatal(&local_38);
        }
        ppSVar9 = &pOVar11->segment;
        uVar2 = *(ushort *)((long)&(pOVar11->tag).content + 4);
        uVar3 = *(ushort *)((long)&(pOVar11->tag).content + 6);
        switch(elementSize) {
        case BIT:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                    (&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x510,FAILED,(char *)0x0,
                     "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                     ,(char (*) [106])
                      "Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
                    );
          kj::_::Debug::Fault::~Fault(&local_38);
          break;
        case BYTE:
        case TWO_BYTES:
        case FOUR_BYTES:
        case EIGHT_BYTES:
          if ((ulong)uVar2 != 0) goto switchD_003dcac5_default;
          asList();
          break;
        case POINTER:
          if (uVar3 != 0) {
            ppSVar9 = ppSVar9 + uVar2;
            goto switchD_003dcac5_default;
          }
          asList();
          break;
        case INLINE_COMPOSITE:
          kj::_::unreachable();
        default:
switchD_003dcac5_default:
          __return_storage_ptr__->segment = this_00;
          __return_storage_ptr__->capTable = pCVar6;
          __return_storage_ptr__->ptr = (byte *)ppSVar9;
          __return_storage_ptr__->elementCount = uVar4 >> 2 & 0x1fffffff;
          __return_storage_ptr__->step = ((uint)uVar3 + (uint)uVar2) * 0x40;
          __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
          __return_storage_ptr__->structPointerCount = uVar3;
          __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
          pOVar11 = (OrphanBuilder *)(ppSVar9 + -1);
          goto LAB_003dcbe2;
        }
      }
      else {
        uVar5 = *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar8 * 4);
        if (elementSize == BIT) {
          if (EVar8 == BIT) {
LAB_003dcb50:
            __return_storage_ptr__->segment = this_00;
            __return_storage_ptr__->capTable = pCVar6;
            __return_storage_ptr__->ptr = (byte *)pOVar11;
            __return_storage_ptr__->elementCount = uVar4 >> 3;
            __return_storage_ptr__->step = (uint)(EVar8 == POINTER) * 0x40 + uVar5;
            __return_storage_ptr__->structDataSize = uVar5;
            __return_storage_ptr__->structPointerCount = (ushort)(EVar8 == POINTER);
            __return_storage_ptr__->elementSize = EVar8;
            goto LAB_003dcbe2;
          }
          asList();
        }
        else if (EVar8 == BIT) {
          asList();
        }
        else if (uVar5 < *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)elementSize * 4)) {
          asList();
        }
        else {
          if ((elementSize != POINTER) || (EVar8 == POINTER)) goto LAB_003dcb50;
          asList();
        }
      }
    }
    else {
      asList();
    }
  }
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
  __return_storage_ptr__->elementSize = elementSize;
  pOVar11 = (OrphanBuilder *)0x0;
LAB_003dcbe2:
  this->location = &pOVar11->tag;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asList(ElementSize elementSize) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableListPointer(
      tagAsPtr(), location, segment, capTable, elementSize, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  // (Actually, currently this is not true for primitive lists, but let's not turn into a bug if
  // it changes!)
  location = result.getLocation();

  return result;
}